

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.cpp
# Opt level: O0

bool __thiscall sjtu::TrainManager::buy_ticket(TrainManager *this,orderType *order)

{
  byte bVar1;
  __type _Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  long in_RSI;
  long in_RDI;
  pair<long,_bool> pVar8;
  int i_1;
  int i;
  bool end_flag;
  bool flag;
  timeType current_time;
  int single_ticket_price;
  int day_id;
  int min_ticket_num;
  trainType *train;
  pair<long,_bool> ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  allocator *in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  StringHasher *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd08;
  allocator *paVar9;
  trainType *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>
  *in_stack_fffffffffffffd50;
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [32];
  int local_188;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [36];
  timeType local_134;
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  timeType local_d8;
  int local_c8;
  byte local_c2;
  byte local_c1;
  timeType local_c0;
  int local_b0;
  allocator local_a9;
  string local_a8 [32];
  int local_88;
  int local_84;
  long local_80;
  long local_78;
  undefined1 local_70;
  allocator local_51;
  string local_50 [32];
  hashType local_30;
  long local_28;
  byte local_20;
  long local_18;
  bool local_1;
  
  local_18 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,(char *)(in_RSI + 0x15),&local_51);
  local_30 = StringHasher::operator()
                       (in_stack_fffffffffffffd00,
                        (string *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  pVar8 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (in_stack_fffffffffffffd50,
                     (unsigned_long_long *)
                     CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48));
  local_78 = pVar8.first;
  local_70 = pVar8.second;
  local_28 = local_78;
  local_20 = local_70;
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if ((local_20 & 1) == 0) {
    local_1 = false;
  }
  else {
    local_80 = (**(code **)(**(long **)(in_RDI + 0x20) + 0x10))(*(long **)(in_RDI + 0x20),&local_28)
    ;
    local_84 = *(int *)(local_18 + 0xa0);
    iVar3 = timeType::dateminus((timeType *)(local_18 + 0x2c),(timeType *)(local_80 + 0xa768));
    pcVar5 = (char *)(local_18 + 0x4c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,pcVar5,&local_a9);
    iVar4 = trainType::get_Delta_date(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    iVar3 = iVar3 + iVar4;
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    local_b0 = 0;
    if ((((iVar3 < 0) ||
         (local_88 = iVar3,
         iVar4 = timeType::dateminus((timeType *)(local_80 + 0xa778),(timeType *)(local_80 + 0xa768)
                                    ), iVar4 < iVar3)) || ((*(byte *)(local_80 + 0xa799) & 1) == 0))
       || (*(int *)(local_80 + 0x1c) < *(int *)(local_18 + 0xa0))) {
      local_1 = false;
    }
    else {
      timeType::timeType(&local_c0,(timeType *)(local_80 + 0xa788));
      local_c0._0_8_ = *(undefined8 *)(local_18 + 0x2c);
      local_c1 = 0;
      local_c2 = 0;
      for (local_c8 = 0; local_c8 < *(int *)(local_80 + 0x18); local_c8 = local_c8 + 1) {
        if (local_c8 != 0) {
          timeType::operator+((timeType *)
                              CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                              (int *)in_stack_fffffffffffffcf0);
          local_c0.month = local_d8.month;
          local_c0.day = local_d8.day;
          local_c0.hour = local_d8.hour;
          local_c0.minute = local_d8.minute;
        }
        if ((local_c1 & 1) != 0) {
          local_b0 = *(int *)(local_80 + (long)local_c8 * 0x1a8 + 0x1bc) + local_b0;
          local_84 = min<int>(&local_84,
                              (int *)(local_80 + (long)local_c8 * 0x1a8 + 0x4c + (long)local_88 * 4)
                             );
        }
        lVar7 = (long)local_c8;
        lVar6 = local_80 + 0x20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f8,(char *)(lVar6 + lVar7 * 0x1a8),&local_f9);
        pcVar5 = (char *)(local_18 + 0x75);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_120,pcVar5,&local_121);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        std::__cxx11::string::~string(local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
        std::__cxx11::string::~string(local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        if ((bVar1 & 1) != 0) {
          *(undefined8 *)(local_18 + 0x3c) = local_c0._0_8_;
          *(undefined8 *)(local_18 + 0x44) = local_c0._8_8_;
          *(int *)(local_18 + 0xa4) = local_b0;
          local_c2 = 1;
          break;
        }
        if (local_c8 != 0) {
          timeType::operator+((timeType *)
                              CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                              (int *)in_stack_fffffffffffffcf0);
          local_c0.month = local_134.month;
          local_c0.day = local_134.day;
          local_c0.hour = local_134.hour;
          local_c0.minute = local_134.minute;
        }
        lVar7 = (long)local_c8;
        lVar6 = local_80 + 0x20;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_158,(char *)(lVar6 + lVar7 * 0x1a8),&local_159);
        pcVar5 = (char *)(local_18 + 0x4c);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_180,pcVar5,&local_181);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
        std::__cxx11::string::~string(local_180);
        std::allocator<char>::~allocator((allocator<char> *)&local_181);
        std::__cxx11::string::~string(local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
        if (_Var2) {
          local_c0._0_8_ = *(undefined8 *)(local_18 + 0x2c);
          *(undefined8 *)(local_18 + 0x2c) = local_c0._0_8_;
          *(undefined8 *)(local_18 + 0x34) = local_c0._8_8_;
          local_c1 = 1;
        }
      }
      if (((local_c1 & 1) == 0) || ((local_c2 & 1) == 0)) {
        local_1 = false;
      }
      else {
        if (local_84 == *(int *)(local_18 + 0xa0)) {
          local_c1 = 0;
          for (local_188 = 0; local_188 < *(int *)(local_80 + 0x18); local_188 = local_188 + 1) {
            if ((local_c1 & 1) != 0) {
              lVar6 = local_80 + 0x20 + (long)local_188 * 0x1a8;
              *(int *)(lVar6 + 0x2c + (long)local_88 * 4) =
                   *(int *)(lVar6 + 0x2c + (long)local_88 * 4) - *(int *)(local_18 + 0xa0);
            }
            pcVar5 = (char *)(local_80 + 0x20 + (long)local_188 * 0x1a8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1a8,pcVar5,&local_1a9);
            pcVar5 = (char *)(local_18 + 0x75);
            paVar9 = &local_1d1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1d0,pcVar5,paVar9);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
            std::__cxx11::string::~string(local_1d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
            std::__cxx11::string::~string(local_1a8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
            if ((bVar1 & 1) != 0) break;
            in_stack_fffffffffffffce8 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_80 + 0x20 + (long)local_188 * 0x1a8);
            in_stack_fffffffffffffcf0 = &local_1f9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_1f8,(char *)in_stack_fffffffffffffce8,in_stack_fffffffffffffcf0);
            pcVar5 = (char *)(local_18 + 0x4c);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_220,pcVar5,&local_221);
            _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
            std::__cxx11::string::~string(local_220);
            std::allocator<char>::~allocator((allocator<char> *)&local_221);
            std::__cxx11::string::~string(local_1f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
            if (_Var2) {
              local_c1 = 1;
            }
          }
          *(undefined4 *)(local_18 + 0xa8) = 0;
        }
        else {
          *(undefined4 *)(local_18 + 0xa8) = 1;
        }
        (**(code **)(**(long **)(in_RDI + 0x20) + 0x18))
                  (*(long **)(in_RDI + 0x20),local_80 + 0xa7a0);
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool TrainManager::buy_ticket(orderType *order)
	{
		auto ret = TrainBpTree -> find(hasher(order -> trainID));
		if (ret.second == false) return 0;
		else
		{
			trainType *train = TrainFile -> read(ret.first);
			int min_ticket_num = order -> num , day_id = timeType::dateminus(order -> date[0] , train -> saleDate[0]) + train -> get_Delta_date(std::string(order -> station[0])) , single_ticket_price = 0;
			if (day_id < 0 || day_id > timeType::dateminus(train -> saleDate[1] , train -> saleDate[0]) || train -> is_released == false || order -> num > train -> seatNum) return 0;
			else
			{
				timeType current_time = train -> startTime;
				current_time.month = order -> date[0].month , current_time.day = order -> date[0].day;
				bool flag = false , end_flag = false;
				for (int i = 0;i < train -> stationNum;++ i)
				{
					if (i) current_time = current_time + train -> stations[i].travelTime;
					if (flag) single_ticket_price += train -> stations[i].price , min_ticket_num = min(min_ticket_num , train -> stations[i].seatNum[day_id]);
					if (std::string(train -> stations[i].stationName) == std::string(order -> station[1]))
					{
						order -> date[1] = current_time , order -> price = single_ticket_price , end_flag = true;
						break;
					}
					if (i) current_time = current_time + train -> stations[i].stopoverTime;
					if (std::string(train -> stations[i].stationName) == std::string(order -> station[0]))
					{
						current_time.month = order -> date[0].month , current_time.day = order -> date[0].day;
						order -> date[0] = current_time , flag = true;
					}
				}
				if (!flag || !end_flag) return false;
				if (min_ticket_num == order -> num)
				{
					flag = false;
					for (int i = 0;i < train -> stationNum;++ i)
					{
						if (flag) train -> stations[i].seatNum[day_id] -= order -> num;
						if (std::string(train -> stations[i].stationName) == std::string(order -> station[1])) break;
						if (std::string(train -> stations[i].stationName) == std::string(order -> station[0])) flag = true;
					}
					order -> status = success;
				}
				else order -> status = pending;
				TrainFile -> save(train -> offset);
				return true;
			}
		}
	}